

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  byte *__src;
  char *pcVar1;
  byte bVar2;
  mtree *mtree;
  __mode_t p;
  uint uVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  int *piVar7;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar8;
  archive_string *paVar9;
  ulong uVar10;
  size_t sVar11;
  size_t len;
  int64_t iVar12;
  mtree_entry *pmVar13;
  char *pcVar14;
  size_t sVar15;
  char cVar16;
  char *pcVar17;
  mtree_entry *pmVar18;
  byte *pbVar19;
  long lVar20;
  mtree_entry *pmVar21;
  char *pcVar22;
  byte *__dest;
  long lVar23;
  mtree_entry *pmVar24;
  long lVar25;
  undefined1 *puVar26;
  char *pcVar27;
  archive_entry *entry_00;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  long local_108;
  archive_entry *local_100;
  uint local_f4;
  mtree_entry *local_f0;
  mtree_entry *local_e8;
  archive_entry *local_e0;
  mtree_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  local_e0 = entry;
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar17 = (char *)0xffffffe2;
      goto LAB_0012a8ed;
    }
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_100 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_108 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = (mtree_entry *)&mtree->entries;
      local_f0 = (mtree_entry *)0x0;
LAB_0012a107:
      lVar23 = 0;
      pcVar14 = (char *)0x0;
LAB_0012a10d:
      pmVar18 = (mtree_entry *)local_c0.st_dev;
      if (-1 < (long)local_c0.st_dev) {
        pvVar8 = memchr(__s,10,local_c0.st_dev);
        if (pvVar8 != (void *)0x0) {
          pmVar18 = (mtree_entry *)((long)pvVar8 + (1 - (long)__s));
          local_c0.st_dev = (__dev_t)pmVar18;
        }
        if ((long)(pcVar14 + (long)&pmVar18->next) < 0x10000) {
          paVar9 = archive_string_ensure
                             ((archive_string *)mtree,(size_t)(pcVar14 + (long)&pmVar18->next + 1));
          if (paVar9 != (archive_string *)0x0) {
            memcpy((mtree->line).s + (long)pcVar14,__s,local_c0.st_dev);
            __archive_read_consume(a,local_c0.st_dev);
            pcVar17 = pcVar14 + (long)(mtree_entry **)local_c0.st_dev;
            (mtree->line).s[(long)pcVar17] = '\0';
            pcVar27 = (mtree->line).s;
            __dest = (byte *)(pcVar27 + lVar23);
            do {
              bVar2 = *__dest;
              pbVar19 = __dest;
              if (bVar2 < 0x5c) {
                if (bVar2 == 0) goto LAB_0012a1e8;
                if (bVar2 != 10) {
                  if (bVar2 != 0x23) goto LAB_0012a1db;
                  if (pvVar8 == (void *)0x0) goto LAB_0012a1e8;
                }
                if (pcVar17 == (char *)0x0) goto LAB_0012a71f;
                if (-1 < (long)pcVar17) {
                  lVar25 = -(long)pcVar14;
                  pcVar17 = pcVar14 + 1;
                  lVar23 = 0;
                  goto LAB_0012a25d;
                }
                free_options((mtree_option *)local_100);
                if ((int)pcVar17 != 0) goto LAB_0012a8ed;
                goto LAB_00129cca;
              }
              if (bVar2 == 0x5c) {
                __src = __dest + 1;
                bVar2 = __dest[1];
                pbVar19 = __src;
                if (bVar2 != 0x5c) {
                  if (bVar2 == 0) goto LAB_0012a1e8;
                  pbVar19 = __dest;
                  if (bVar2 == 10) goto LAB_0012a216;
                }
              }
LAB_0012a1db:
              __dest = pbVar19 + 1;
            } while( true );
          }
          pcVar17 = "Can\'t allocate working buffer";
          iVar4 = 0xc;
        }
        else {
          pcVar17 = "Line too long";
          iVar4 = 0x54;
        }
        goto LAB_0012a8d7;
      }
      goto LAB_0012a8de;
    }
LAB_0012a71f:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_100);
  }
LAB_00129cca:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar18 = mtree->this_entry;
  pcVar17 = (char *)0x1;
  if (pmVar18 != (mtree_entry *)0x0) {
    paVar9 = &mtree->current_dir;
    entry_00 = local_e0;
    do {
      pcVar17 = pmVar18->name;
      if (((*pcVar17 == '.') && (pcVar17[1] == '.')) && (pcVar17[2] == '\0')) {
        pmVar18->used = '\x01';
        sVar15 = (mtree->current_dir).length;
        if (sVar15 != 0) {
          pcVar17 = paVar9->s;
          pcVar14 = pcVar17 + sVar15;
          do {
            pcVar27 = pcVar14;
            pcVar14 = pcVar27 + -1;
            if (pcVar14 < pcVar17) break;
          } while (*pcVar14 != '/');
          pcVar27 = pcVar27 + -2;
          if (pcVar14 < pcVar17) {
            pcVar27 = pcVar14;
          }
          (mtree->current_dir).length = (size_t)(pcVar27 + (1 - (long)pcVar17));
        }
      }
      else if (pmVar18->used == '\0') {
        pmVar18->used = '\x01';
        local_100 = entry_00;
        archive_entry_set_filetype(entry_00,0x8000);
        archive_entry_set_size(entry_00,0);
        (mtree->contents_name).length = 0;
        local_f4 = 0;
        uVar3 = parse_line(a,entry_00,mtree,pmVar18,(int *)&local_f4);
        if (pmVar18->full == '\0') {
          sVar15 = (mtree->current_dir).length;
          if (sVar15 != 0) {
            archive_strcat(paVar9,"/");
          }
          archive_strcat(paVar9,pmVar18->name);
          archive_entry_copy_pathname(entry_00,paVar9->s);
          mVar6 = archive_entry_filetype(entry_00);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar15;
          }
        }
        else {
          archive_entry_copy_pathname(entry_00,pmVar18->name);
          for (pmVar24 = pmVar18->next; pmVar24 != (mtree_entry *)0x0; pmVar24 = pmVar24->next) {
            if (((pmVar24->full != '\0') && (pmVar24->used == '\0')) &&
               (iVar4 = strcmp(pmVar18->name,pmVar24->name), iVar4 == 0)) {
              pmVar24->used = '\x01';
              uVar5 = parse_line(a,local_e0,mtree,pmVar24,(int *)&local_f4);
              if ((int)uVar5 < (int)uVar3) {
                uVar3 = uVar5;
              }
            }
          }
        }
        entry_00 = local_e0;
        if (mtree->checkfs == '\0') {
LAB_0012a865:
          iVar12 = archive_entry_size(entry_00);
          mtree->cur_size = iVar12;
          mtree->offset = 0;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar17 = archive_entry_pathname(local_e0);
          }
          else {
            pcVar17 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry_00);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x4000)) {
            iVar4 = open(pcVar17,0x80000);
            mtree->fd = iVar4;
            __archive_ensure_cloexec_flag(iVar4);
            iVar4 = mtree->fd;
            if (iVar4 == -1) {
              piVar7 = __errno_location();
              if ((*piVar7 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar7,"Can\'t open %s",pcVar17);
                uVar3 = 0xffffffec;
              }
              goto LAB_00129eb9;
            }
          }
          else {
LAB_00129eb9:
            iVar4 = mtree->fd;
          }
          if (iVar4 < 0) {
            iVar4 = lstat(pcVar17,&local_c0);
            if (iVar4 != -1) goto LAB_00129f13;
LAB_00129f48:
            if ((local_f4 & 0x800) == 0) goto LAB_0012a865;
LAB_0012a064:
            pmVar18 = mtree->this_entry;
            goto LAB_0012a06d;
          }
          iVar4 = fstat(iVar4,&local_c0);
          if (iVar4 == -1) {
            piVar7 = __errno_location();
            archive_set_error(&a->archive,*piVar7,"Could not fstat %s",pcVar17);
            close(mtree->fd);
            mtree->fd = -1;
            uVar3 = 0xffffffec;
            goto LAB_00129f48;
          }
LAB_00129f13:
          p = local_c0.st_mode;
          uVar5 = local_c0.st_mode & 0xf000;
          if (uVar5 == 0xa000) {
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 != 0xa000) goto LAB_00129fb2;
LAB_0012a73b:
            uVar5 = local_f4;
            if (((local_f4 & 0x1001) != 1) &&
               ((mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x2000 ||
                (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x6000)))) {
              archive_entry_set_rdev(entry_00,local_c0.st_rdev);
            }
            if ((uVar5 & 0xc) == 0 || (uVar5 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry_00,(ulong)local_c0.st_gid);
            }
            if ((uVar5 & 0x600) == 0 || (uVar5 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry_00,(ulong)local_c0.st_uid);
            }
            if ((uVar5 & 0x1010) != 0x10) {
              archive_entry_set_mtime(entry_00,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((uVar5 & 0x1020) != 0x20) {
              archive_entry_set_nlink(entry_00,(uint)local_c0.st_nlink);
            }
            if ((uVar5 & 0x1040) != 0x40) {
              archive_entry_set_perm(entry_00,p);
            }
            if ((uVar5 & 0x1080) != 0x80) {
              archive_entry_set_size(entry_00,local_c0.st_size);
            }
            archive_entry_set_ino(entry_00,local_c0.st_ino);
            archive_entry_set_dev(entry_00,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_100,&local_d0);
            entry_00 = local_100;
            goto LAB_0012a865;
          }
          if ((uVar5 == 0x8000) && (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0x8000))
          goto LAB_0012a73b;
LAB_00129fb2:
          if (((~p & 0xc000) == 0) && (mVar6 = archive_entry_filetype(entry_00), mVar6 == 0xc000))
          goto LAB_0012a73b;
          switch(uVar5 - 0x1000 >> 0xc) {
          case 0:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x1000) goto LAB_0012a73b;
            break;
          case 1:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x2000) goto LAB_0012a73b;
            break;
          case 3:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x4000) goto LAB_0012a73b;
            break;
          case 5:
            mVar6 = archive_entry_filetype(entry_00);
            if (mVar6 == 0x6000) goto LAB_0012a73b;
          }
          if (-1 < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = -1;
          if ((local_f4 & 0x800) != 0) goto LAB_0012a064;
          if (uVar3 == 0) {
            pcVar17 = archive_entry_pathname(entry_00);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar17
                             );
            uVar3 = 0xffffffec;
          }
        }
        pcVar17 = (char *)(ulong)uVar3;
        break;
      }
LAB_0012a06d:
      pcVar17 = (char *)0x1;
      pmVar18 = pmVar18->next;
      mtree->this_entry = pmVar18;
    } while (pmVar18 != (mtree_entry *)0x0);
  }
LAB_0012a8ed:
  return (int)pcVar17;
LAB_0012a25d:
  uVar10 = (ulong)(byte)pcVar27[lVar23];
  if (0x2f < uVar10) goto LAB_0012a3f6;
  if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_0012a298;
    if (uVar10 == 0x2f) {
      iVar4 = strncmp(pcVar27 + lVar23,"/set",4);
      if (iVar4 == 0) {
        if ((pcVar27[lVar23 + 4] == ' ') || (pcVar27[lVar23 + 4] == '\t')) {
          pcVar27 = pcVar27 + lVar23 + 4;
          goto LAB_0012a4e3;
        }
      }
      else {
        iVar4 = strncmp(pcVar27 + lVar23,"/unset",6);
        if ((iVar4 == 0) && ((pcVar27[lVar23 + 6] == ' ' || (pcVar27[lVar23 + 6] == '\t')))) {
          pcVar17 = strchr(pcVar27 + lVar23 + 6,0x3d);
          if (pcVar17 != (char *)0x0) {
            pcVar17 = "/unset shall not contain `=\'";
            iVar4 = -1;
            goto LAB_0012a8d7;
          }
          sVar11 = strspn(pcVar27 + lVar23 + 6," \t\r\n");
          cVar16 = pcVar27[lVar23 + 6 + sVar11];
          if (cVar16 == '\0') goto LAB_0012a298;
          pcVar27 = pcVar27 + lVar23 + sVar11 + 6;
          goto LAB_0012a374;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_108);
      goto LAB_0012a8de;
    }
    goto LAB_0012a3f6;
  }
  lVar23 = lVar23 + 1;
  lVar25 = lVar25 + 1;
  pcVar17 = pcVar17 + -1;
  goto LAB_0012a25d;
LAB_0012a4e3:
  sVar11 = strspn(pcVar27," \t\r\n");
  if (pcVar27[sVar11] == '\0') goto LAB_0012a298;
  pcVar14 = pcVar27 + sVar11;
  sVar11 = strcspn(pcVar14," \t\r\n");
  pcVar27 = pcVar14 + sVar11;
  pcVar17 = strchr(pcVar14,0x3d);
  sVar15 = (long)pcVar17 - (long)pcVar14;
  if (pcVar27 < pcVar17) {
    sVar15 = sVar11;
  }
  remove_option((mtree_option **)&local_100,pcVar14,sVar15);
  uVar3 = add_option(a,(mtree_option **)&local_100,pcVar14,sVar11);
  if (uVar3 != 0) goto LAB_0012a8af;
  goto LAB_0012a4e3;
LAB_0012a374:
  do {
    sVar11 = strcspn(pcVar27," \t\r\n");
    sVar15 = sVar11;
    if (sVar11 == 3) {
      if (((cVar16 != 'a') || (pcVar27[1] != 'l')) || (pcVar27[2] != 'l')) {
        sVar15 = 3;
        goto LAB_0012a3cb;
      }
      free_options((mtree_option *)local_100);
      local_100 = (archive_entry *)0x0;
    }
    else {
LAB_0012a3cb:
      remove_option((mtree_option **)&local_100,pcVar27,sVar15);
    }
    pcVar27 = pcVar27 + sVar11;
    sVar11 = strspn(pcVar27," \t\r\n");
    cVar16 = pcVar27[sVar11];
    pcVar27 = pcVar27 + sVar11;
  } while (cVar16 != '\0');
LAB_0012a298:
  local_108 = local_108 + 1;
  __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
  if (__s == (void *)0x0) goto LAB_0012a71f;
  goto LAB_0012a107;
LAB_0012a3f6:
  local_e8 = (mtree_entry *)local_c0.st_dev;
  local_d8 = (mtree_entry *)CONCAT44(local_d8._4_4_,(uint32_t)local_d0);
  pmVar18 = (mtree_entry *)malloc(0x20);
  if (pmVar18 != (mtree_entry *)0x0) {
    pmVar24 = (mtree_entry *)(pcVar27 + lVar23);
    pcVar22 = pcVar14 + (long)&local_e8->next;
    lVar20 = (long)pcVar22 - lVar23;
    *(undefined8 *)((long)&pmVar18->options + 2) = 0;
    *(undefined8 *)((long)&pmVar18->name + 2) = 0;
    pmVar18->next = (mtree_entry *)0x0;
    pmVar18->options = (mtree_option *)0x0;
    pmVar13 = local_f0;
    if (local_f0 == (mtree_entry *)0x0) {
      pmVar13 = local_c8;
    }
    pmVar13->next = pmVar18;
    if ((int)local_d8 == 0) {
      local_e8 = pmVar24;
      sVar11 = strcspn((char *)pmVar24," \t\r\n");
      pmVar24 = (mtree_entry *)(pcVar27 + lVar23 + sVar11);
      pmVar13 = local_e8;
      local_f0 = (mtree_entry *)(lVar20 + (long)pmVar24);
    }
    else {
      if (lVar20 < 1) {
        pcVar1 = (char *)((long)pmVar24 + lVar20);
      }
      else {
        pmVar21 = (mtree_entry *)(lVar20 + (long)pmVar24);
        pcVar1 = pcVar27 + lVar23;
        pcVar14 = pcVar14 + (long)pcVar27;
        do {
          pcVar14 = pcVar14 + -1;
          uVar10 = (ulong)(byte)pcVar14[(long)local_e8];
          if ((0x20 < uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) {
            pmVar13 = (mtree_entry *)(pcVar14 + (lVar23 - (long)pcVar22) + (long)local_e8);
            sVar11 = (long)local_e8 - lVar25;
            lVar23 = 1;
            goto LAB_0012a6ca;
          }
          lVar25 = lVar25 + 1;
          pcVar22 = pcVar22 + -1;
          pcVar27 = pcVar17 + -1;
          pcVar17 = pcVar17 + -1;
          pmVar21 = (mtree_entry *)&pmVar21[-1].field_0x1f;
        } while (1 < (long)(pcVar27 + (long)&local_e8->next));
      }
      sVar11 = 0;
      pmVar13 = (mtree_entry *)(pcVar1 + -1);
      local_f0 = (mtree_entry *)(pcVar1 + -1);
    }
LAB_0012a59a:
    pcVar17 = (char *)malloc(sVar11 + 1);
    pmVar18->name = pcVar17;
    if (pcVar17 != (char *)0x0) {
      memcpy(pcVar17,pmVar13,sVar11);
      pcVar17[sVar11] = '\0';
      local_d8 = pmVar18;
      parse_escapes(pcVar17,pmVar18);
      puVar26 = (undefined1 *)&local_100;
      while (puVar26 = *(undefined1 **)puVar26, pmVar13 = (mtree_entry *)&pmVar18->options,
            puVar26 != (undefined1 *)0x0) {
        pcVar17 = *(char **)((long)puVar26 + 8);
        sVar11 = strlen(pcVar17);
        uVar3 = add_option(a,&pmVar18->options,pcVar17,sVar11);
        if (uVar3 != 0) goto LAB_0012a8af;
      }
      while ((local_e8 = pmVar13, sVar11 = strspn((char *)pmVar24," \t\r\n"),
             *(char *)((long)&pmVar24->next + sVar11) != '\0' &&
             (pmVar18 = (mtree_entry *)((long)&pmVar24->next + sVar11), pmVar18 < local_f0))) {
        len = strcspn((char *)pmVar18," \t\r\n");
        pmVar24 = (mtree_entry *)((long)&pmVar18->next + len);
        pmVar21 = (mtree_entry *)strchr((char *)pmVar18,0x3d);
        pmVar13 = local_e8;
        sVar11 = (long)pmVar21 - (long)pmVar18;
        if (pmVar24 < pmVar21) {
          sVar11 = len;
        }
        if (pmVar21 == (mtree_entry *)0x0) {
          sVar11 = len;
        }
        remove_option((mtree_option **)local_e8,(char *)pmVar18,sVar11);
        uVar3 = add_option(a,(mtree_option **)pmVar13,(char *)pmVar18,len);
        pmVar13 = local_e8;
        if (uVar3 != 0) goto LAB_0012a8af;
      }
      local_f0 = local_d8;
      goto LAB_0012a298;
    }
  }
  piVar7 = __errno_location();
  iVar4 = *piVar7;
  pcVar17 = "Can\'t allocate memory";
LAB_0012a8d7:
  archive_set_error(&a->archive,iVar4,pcVar17);
LAB_0012a8de:
  pcVar17 = (char *)0xffffffe2;
  goto LAB_0012a8e3;
LAB_0012a6ca:
  if (((byte)uVar10 < 0x21) && ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0)) {
    sVar11 = lVar23 - 1;
    pmVar13 = pmVar21;
    local_f0 = pmVar21;
    goto LAB_0012a59a;
  }
  local_f0 = pmVar13;
  if ((lVar25 - (long)local_e8) + lVar23 == 0) goto LAB_0012a59a;
  uVar10 = (ulong)(byte)pmVar21[-1].field_0x1e;
  lVar23 = lVar23 + 1;
  pmVar21 = (mtree_entry *)&pmVar21[-1].field_0x1f;
  goto LAB_0012a6ca;
LAB_0012a8af:
  pcVar17 = (char *)(ulong)uVar3;
LAB_0012a8e3:
  free_options((mtree_option *)local_100);
  goto LAB_0012a8ed;
LAB_0012a216:
  memmove(__dest,__src,(size_t)(pcVar27 + (long)(pcVar17 + (1 - (long)__dest))));
  pcVar17 = pcVar17 + -1;
  pcVar27 = (mtree->line).s;
  __dest = __src;
LAB_0012a1e8:
  lVar23 = (long)__dest - (long)pcVar27;
  __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
  pcVar14 = pcVar17;
  if (__s == (void *)0x0) goto LAB_0012a71f;
  goto LAB_0012a10d;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}